

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,char (*rhs) [6])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  void *__s1;
  ulong uVar2;
  size_type sVar3;
  result *prVar4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  char *pcVar7;
  char (*in_R8) [6];
  long *local_e0;
  size_type local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  long local_90;
  undefined8 uStack_88;
  result *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  __s1 = *(void **)this_00;
  uVar2 = *(ulong *)(this_00 + 8);
  local_80 = __return_storage_ptr__;
  sVar6 = strlen(*rhs);
  __n = sVar6;
  if (uVar2 < sVar6) {
    __n = uVar2;
  }
  iVar5 = memcmp(__s1,rhs,__n);
  if ((iVar5 == 0) && (iVar5 = 0, uVar2 != sVar6)) {
    iVar5 = -(uint)(uVar2 < sVar6);
  }
  local_e0 = (long *)&local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"<","");
  local_a0.data_ = (const_pointer)&local_90;
  if (local_e0 == (long *)&local_d0) {
    uStack_88 = uStack_c8;
  }
  else {
    local_a0.data_ = (const_pointer)local_e0;
  }
  local_90 = CONCAT71(uStack_cf,local_d0);
  local_a0.size_ = local_d8;
  local_d8 = 0;
  local_d0 = 0;
  local_e0 = (long *)&local_d0;
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_c0,this_00,&local_a0,(string *)rhs,in_R8);
  sVar3 = local_c0._M_string_length;
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    local_68._8_4_ = local_c0.field_2._8_4_;
    local_68._12_4_ = local_c0.field_2._12_4_;
    local_c0._M_dataplus._M_p = (pointer)&local_68;
  }
  local_68._M_allocated_capacity._4_4_ = local_c0.field_2._M_allocated_capacity._4_4_;
  local_68._M_allocated_capacity._0_4_ = local_c0.field_2._M_allocated_capacity._0_4_;
  local_70 = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_allocated_capacity._0_4_ =
       local_c0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_58 = SUB41((uint)iVar5 >> 0x1f,0);
  pcVar7 = local_c0._M_dataplus._M_p + sVar3;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar7);
  prVar4 = local_80;
  local_80->passed = local_58;
  (local_80->decomposition)._M_dataplus._M_p = (pointer)&(local_80->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((long *)local_a0.data_ != &local_90) {
    operator_delete(local_a0.data_,local_90 + 1);
  }
  if (local_e0 != (long *)&local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  return prVar4;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }